

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

lua_Integer lua_tointeger(lua_State *L,int idx)

{
  int in_ESI;
  lua_State *in_RDI;
  lua_Number num;
  lua_Integer res;
  TValue *o;
  TValue n;
  TValue *in_stack_ffffffffffffffc0;
  TValue *in_stack_ffffffffffffffc8;
  TValue *local_30;
  
  local_30 = index2adr(in_RDI,in_ESI);
  if ((local_30->tt != 3) &&
     (local_30 = luaV_tonumber(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0),
     local_30 == (TValue *)0x0)) {
    return 0;
  }
  return (long)(local_30->value).n;
}

Assistant:

static lua_Integer lua_tointeger(lua_State*L,int idx){
TValue n;
const TValue*o=index2adr(L,idx);
if(tonumber(o,&n)){
lua_Integer res;
lua_Number num=nvalue(o);
lua_number2integer(res,num);
return res;
}
else
return 0;
}